

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupBlock(Gia_Man_t *p,int nBlock)

{
  uint uVar1;
  int iVar2;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  int iVar6;
  
  if (p->vCis->nSize % nBlock != 0) {
    __assert_fail("Gia_ManCiNum(p) % nBlock == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x6bd,"Gia_Man_t *Gia_ManDupBlock(Gia_Man_t *, int)");
  }
  if (p->vCos->nSize % nBlock != 0) {
    __assert_fail("Gia_ManCoNum(p) % nBlock == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x6be,"Gia_Man_t *Gia_ManDupBlock(Gia_Man_t *, int)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar6 = 0; iVar6 < p->vCis->nSize; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManCi(p,iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar1 = 0;
    if (iVar6 % nBlock == 0) {
      uVar1 = Gia_ManAppendCi(p_00);
    }
    pGVar4->Value = uVar1;
  }
  Gia_ManHashAlloc(p_00);
  for (iVar6 = 0; iVar6 < p->nObjs; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManObj(p,iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      iVar2 = Gia_ObjFanin0Copy(pGVar4);
      iLit1 = Gia_ObjFanin1Copy(pGVar4);
      uVar1 = Gia_ManHashAnd(p_00,iVar2,iLit1);
      pGVar4->Value = uVar1;
    }
  }
  for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManCo(p,iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if (iVar6 % nBlock == 0) {
      iVar2 = Gia_ObjFanin0Copy(pGVar4);
      Gia_ManAppendCo(p_00,iVar2);
    }
  }
  Gia_ManSetRegNum(p_00,p->nRegs / nBlock);
  pGVar5 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManDupBlock( Gia_Man_t * p, int nBlock )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj; int i;
    assert( Gia_ManCiNum(p) % nBlock == 0 );
    assert( Gia_ManCoNum(p) % nBlock == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = (i % nBlock == 0) ? Gia_ManAppendCi(pNew) : 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        if ( i % nBlock == 0 )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p)/nBlock );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}